

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_string.cpp
# Opt level: O1

size_t __thiscall pstore::indirect_string::length(indirect_string *this)

{
  size_t sVar1;
  raw_sstring_view *prVar2;
  database_reader local_10;
  
  if (this->is_pointer_ == true) {
    prVar2 = (this->field_2).str_;
  }
  else {
    local_10.addr_.a_ = (this->field_2).address_;
    if ((local_10.addr_.a_ & 1) == 0) {
      local_10.db_ = this->db_;
      sVar1 = serialize::string_helper::read_length<pstore::serialize::archive::database_reader>
                        (&local_10);
      return sVar1;
    }
    prVar2 = (raw_sstring_view *)(local_10.addr_.a_ & 0xfffffffffffffffe);
  }
  return prVar2->size_;
}

Assistant:

std::size_t indirect_string::length () const {
        if (is_pointer_) {
            return str_->length ();
        }
        if (address_ & in_heap_mask) {
            return reinterpret_cast<sstring_view<char const *> const *> (address_ & ~in_heap_mask)
                ->length ();
        }
        return serialize::string_helper::read_length (
            serialize::archive::make_reader (db_, address{address_}));
    }